

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

char * fmt::v7::detail::utf8_decode(char *buf,uint32_t *c,int *e)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  uVar1 = (uint)((byte)*buf >> 3);
  lVar3 = (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"[uVar1];
  uVar2 = ((uint)(byte)*buf & utf8_decode::masks[lVar3]) << 0x12;
  *c = uVar2;
  uVar2 = ((byte)buf[1] & 0x3f) << 0xc | uVar2;
  *c = uVar2;
  uVar2 = ((byte)buf[2] & 0x3f) << 6 | uVar2;
  *c = uVar2;
  uVar2 = ((byte)buf[3] & 0x3f | uVar2) >> (*(byte *)(utf8_decode::shiftc + lVar3) & 0x1f);
  *c = uVar2;
  uVar2 = (uint)(uVar2 < utf8_decode::mins[lVar3]) << 6;
  *e = uVar2;
  uVar2 = (uint)((*c & 0xfffff800) == 0xd800) << 7 | uVar2;
  *e = uVar2;
  uVar2 = (uint)(0x10ffff < *c) << 8 | uVar2;
  *e = uVar2;
  uVar2 = (byte)buf[1] >> 2 & 0x30 | uVar2;
  *e = uVar2;
  uVar2 = (byte)buf[2] >> 4 & 0xc | uVar2;
  *e = uVar2;
  *e = (((byte)buf[3] >> 6 | uVar2) ^ 0x2a) >> (*(byte *)(utf8_decode::shifte + lVar3) & 0x1f);
  return buf + (ulong)((0x80ff0000U >> uVar1 & 1) != 0) + lVar3;
}

Assistant:

FMT_FUNC const char* utf8_decode(const char* buf, uint32_t* c, int* e) {
  static const char lengths[] = {1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
                                 1, 1, 1, 1, 1, 0, 0, 0, 0, 0, 0,
                                 0, 0, 2, 2, 2, 2, 3, 3, 4, 0};
  static const int masks[] = {0x00, 0x7f, 0x1f, 0x0f, 0x07};
  static const uint32_t mins[] = {4194304, 0, 128, 2048, 65536};
  static const int shiftc[] = {0, 18, 12, 6, 0};
  static const int shifte[] = {0, 6, 4, 2, 0};

  auto s = reinterpret_cast<const unsigned char*>(buf);
  int len = lengths[s[0] >> 3];

  // Compute the pointer to the next character early so that the next
  // iteration can start working on the next character. Neither Clang
  // nor GCC figure out this reordering on their own.
  const char* next = buf + len + !len;

  // Assume a four-byte character and load four bytes. Unused bits are
  // shifted out.
  *c = uint32_t(s[0] & masks[len]) << 18;
  *c |= uint32_t(s[1] & 0x3f) << 12;
  *c |= uint32_t(s[2] & 0x3f) << 6;
  *c |= uint32_t(s[3] & 0x3f) << 0;
  *c >>= shiftc[len];

  // Accumulate the various error conditions.
  *e = (*c < mins[len]) << 6;       // non-canonical encoding
  *e |= ((*c >> 11) == 0x1b) << 7;  // surrogate half?
  *e |= (*c > 0x10FFFF) << 8;       // out of range?
  *e |= (s[1] & 0xc0) >> 2;
  *e |= (s[2] & 0xc0) >> 4;
  *e |= (s[3]) >> 6;
  *e ^= 0x2a;  // top two bits of each tail byte correct?
  *e >>= shifte[len];

  return next;
}